

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  ImDrawVert *pIVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [4];
  ImVec2 *pIVar4;
  ImDrawList *pIVar5;
  char *pcVar6;
  bool bVar7;
  uint uVar8;
  undefined4 uVar9;
  float fVar10;
  ImU32 col_00;
  int iVar11;
  ulong uVar12;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined7 extraout_var_01;
  char *text_end;
  void *pvVar13;
  undefined1 auVar14 [8];
  char cVar15;
  undefined4 uVar16;
  uint uVar17;
  long lVar18;
  int picker_type;
  uint uVar19;
  ImVec2 IVar20;
  ImVec2 *out_r;
  ImGuiContext *g;
  undefined1 auVar21 [8];
  int iVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  ImVec2 p_min;
  ImVec2 pos;
  ImVec2 pos_00;
  float fVar28;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  int iVar29;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined1 extraout_var_02 [12];
  undefined1 auVar27 [16];
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  int iVar30;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  float fVar31;
  float fVar32;
  ImVec2 p_max;
  ImVec2 gradient_p1;
  ImVec2 p_max_00;
  ImVec2 half_sz;
  ImVec2 half_sz_00;
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  undefined1 auVar40 [16];
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  undefined4 local_26c;
  float local_268;
  float V;
  float local_260;
  float local_25c;
  undefined1 local_258 [4];
  undefined1 auStack_254 [8];
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  undefined8 uStack_230;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  ImVec2 picker_size;
  float afStack_210 [2];
  ImVec2 *local_208;
  ImVec2 local_200;
  float local_1f8;
  float fStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  ImVec2 backup_pos;
  ImVec2 local_1d8;
  float vv;
  float fStack_1cc;
  ImVec2 local_1c8;
  undefined8 uStack_1c0;
  undefined1 local_1b8 [8];
  uint uStack_1b0;
  uint uStack_1ac;
  ImDrawList *local_1a0;
  ImVec2 picker_pos;
  ImVec2 triangle_pc;
  ImVec2 triangle_pa;
  float ww;
  float fStack_154;
  ImVec2 local_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  size_t local_f0;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined8 local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  float backup_initial_col [4];
  ImVec2 uv_white;
  ImVec2 trc;
  ImVec2 trb;
  undefined1 auVar34 [16];
  
  auVar21 = (undefined1  [8])GImGui;
  uStack_230 = local_238;
  local_118._8_8_ = local_118._0_8_;
  local_118._0_8_ = ref_col;
  IVar20 = (ImVec2)GImGui->CurrentWindow;
  ((ImGuiWindow *)IVar20)->WriteAccessed = true;
  local_1a0 = ((ImGuiWindow *)IVar20)->DrawList;
  local_208 = (ImVec2 *)col;
  local_b8 = label;
  PushID(label);
  BeginGroup();
  uVar17 = (uint)~flags >> 4 & 0x10 | flags;
  local_238 = auVar21;
  if ((flags & 8U) == 0) {
    if ((flags & 0x6000000U) == 0 || (flags & 0x10002U) == 0) {
      bVar7 = BeginPopup("context",0);
      if (bVar7) {
        if ((flags & 0x6000000U) == 0) {
          picker_size.x = GImGui->FontSize * 8.0;
          fVar25 = (GImGui->Style).FramePadding.y;
          local_248 = (undefined1  [8])GImGui;
          picker_size.y =
               picker_size.x -
               (fVar25 + fVar25 + GImGui->FontSize + (GImGui->Style).ItemInnerSpacing.x);
          if (picker_size.y <= 1.0) {
            picker_size.y = 1.0;
          }
          local_228._0_4_ = flags & 2;
          local_1c8 = IVar20;
          PushItemWidth(picker_size.x);
          for (iVar11 = 0; iVar11 != 2; iVar11 = iVar11 + 1) {
            if (iVar11 == 1) {
              Separator();
            }
            PushID(iVar11);
            uVar19 = (uint)(iVar11 == 1) * 0x4000000 +
                     (uint)(iVar11 == 0) * 0x2000000 + local_228._0_4_ + 0x1a8;
            backup_pos = (GImGui->CurrentWindow->DC).CursorPos;
            bVar7 = Selectable("##selectable",false,0,&picker_size);
            if (bVar7) {
              *(uint *)((long)local_248 + 0x2a3c) =
                   uVar19 & 0x6000000 | *(uint *)((long)local_248 + 0x2a3c) & 0xf9ffffff;
            }
            SetCursorScreenPos(&backup_pos);
            uVar12 = (ulong)((uVar19 & 2) == 0);
            memset(backup_initial_col + uVar12 + 3,0,(ulong)((uVar19 & 2) * 2));
            memcpy(backup_initial_col,local_208,uVar12 * 4 + 0xc);
            ColorPicker4("##dummypicker",backup_initial_col,uVar19,(float *)0x0);
            PopID();
            auVar21 = local_238;
          }
          PopItemWidth();
          IVar20 = local_1c8;
          auVar14 = local_248;
          if ((flags & 0x10002U) == 0) {
            Separator();
            goto LAB_0017640c;
          }
        }
        else {
          auVar14 = (undefined1  [8])GImGui;
          if ((flags & 0x10002U) == 0) {
LAB_0017640c:
            CheckboxFlags("Alpha Bar",(uint *)&((ImGuiContext *)auVar14)->ColorEditOptions,0x10000);
          }
        }
        EndPopup();
      }
      goto LAB_0017642c;
    }
  }
  else {
LAB_0017642c:
    if ((flags & 0x6000000U) == 0) {
      uVar8 = ((ImGuiContext *)auVar21)->ColorEditOptions & 0x6000000;
      uVar19 = 0x2000000;
      if (uVar8 != 0) {
        uVar19 = uVar8;
      }
      uVar17 = uVar17 | uVar19;
    }
  }
  uVar19 = (uVar17 & 0x6000000) - 1;
  if ((uVar17 & 0x6000000 ^ uVar19) <= uVar19) {
    __assert_fail("ImIsPowerOfTwo((int)(flags & ImGuiColorEditFlags__PickerMask))",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x2f9b,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  if ((uVar17 & 8) == 0) {
    uVar17 = uVar17 | ((ImGuiContext *)auVar21)->ColorEditOptions & 0x10000U;
  }
  uVar19 = uVar17 & 0x10002;
  IVar20 = (((ImGuiWindow *)IVar20)->DC).CursorPos;
  fVar25 = (GImGui->Style).FramePadding.y;
  _local_1b8 = ZEXT416((uint)(fVar25 + fVar25 + GImGui->FontSize));
  picker_pos = IVar20;
  fVar23 = CalcItemWidth();
  pIVar4 = local_208;
  fVar25 = (((ImGuiContext *)auVar21)->Style).ItemInnerSpacing.x;
  fVar23 = fVar23 - ((float)local_1b8._0_4_ + fVar25) * (float)(byte)((uVar19 == 0x10000) + 1);
  uVar8 = -(uint)(fVar23 <= (float)local_1b8._0_4_);
  fStack_1f4 = (float)(extraout_var_02._0_4_ & local_1b8._4_4_);
  uStack_1f0 = extraout_var_02._4_4_ & uStack_1b0;
  uStack_1ec = extraout_var_02._8_4_ & uStack_1ac;
  local_1f8 = (float)(~uVar8 & (uint)fVar23 | uVar8 & local_1b8._0_4_);
  local_f0 = (ulong)((uVar17 & 2) == 0) * 4 + 0xc;
  memcpy(backup_initial_col,local_208,local_f0);
  local_260 = local_1f8 * 0.08;
  local_d8 = ZEXT416((uint)(local_1f8 * 0.5));
  fVar39 = local_1f8 * 0.5 - local_260;
  _local_108 = ZEXT416((uint)fVar39);
  uStack_1c0 = 0;
  fVar23 = IVar20.x;
  fVar31 = local_1f8 + fVar23;
  fVar24 = fVar25 + fVar31;
  _local_248 = ZEXT416((uint)fVar24);
  local_228._4_4_ = local_1b8._4_4_;
  local_228._0_4_ = (float)local_1b8._0_4_ + fVar24;
  fStack_220 = (float)uStack_1b0;
  fStack_21c = (float)uStack_1ac;
  local_200.x = ((float)local_1b8._0_4_ + local_1f8) * 0.5 + fVar23;
  local_200.y = local_1f8 * 0.5 + IVar20.y;
  auStack_254._0_4_ = local_200.y;
  local_258 = (undefined1  [4])local_200.x;
  auStack_254._4_4_ = (float)local_1b8._4_4_ * 0.0 + 0.0;
  fStack_24c = fStack_1f4 * 0.0 + 0.0;
  fVar39 = fVar39 - (float)(int)(local_1f8 * 0.027);
  triangle_pa.y = 0.0;
  fVar24 = fVar39 * -0.5;
  fVar28 = fVar39 * -0.866025;
  fVar32 = fVar39 * 0.866025;
  local_1c8 = IVar20;
  triangle_pc.x = fVar24;
  triangle_pc.y = fVar32;
  triangle_pa.x = fVar39;
  local_150.x = fVar24;
  local_150.y = fVar28;
  ColorConvertRGBtoHSV(pIVar4->x,pIVar4->y,pIVar4[1].x,&local_25c,&local_268,&V);
  PushItemFlag(8,true);
  local_c8 = local_1c8.y;
  fStack_c4 = local_1c8.y;
  fStack_c0 = local_1c8.y;
  fStack_bc = local_1c8.y;
  local_128 = local_1c8.y;
  fStack_124 = local_1c8.y;
  fStack_120 = local_1c8.y;
  fStack_11c = local_1c8.y;
  if ((uVar17 >> 0x1a & 1) == 0) {
    if ((uVar17 >> 0x19 & 1) == 0) {
      uVar16 = 0;
      local_26c._0_1_ = '\0';
      auVar2._12_4_ = 0;
      auVar2._0_12_ = _auStack_254;
      _local_258 = auVar2 << 0x20;
    }
    else {
      picker_size.y = local_1f8;
      picker_size.x = local_1f8;
      InvisibleButton("sv",&picker_size);
      bVar7 = IsItemActive();
      if (bVar7) {
        auVar33._0_4_ = local_1f8 + -1.0;
        IVar20 = (((ImGuiContext *)auVar21)->IO).MousePos;
        auVar27._0_4_ = IVar20.x - local_1c8.x;
        auVar27._4_4_ = IVar20.y - local_1c8.y;
        auVar27._8_4_ = 0.0 - (float)uStack_1c0;
        auVar27._12_4_ = 0.0 - uStack_1c0._4_4_;
        auVar33._4_4_ = auVar33._0_4_;
        auVar33._8_4_ = auVar33._0_4_;
        auVar33._12_4_ = auVar33._0_4_;
        auVar27 = divps(auVar27,auVar33);
        fVar10 = auVar27._4_4_;
        iVar11 = -(uint)(1.0 < auVar27._0_4_);
        iVar22 = -(uint)(1.0 < fVar10);
        auVar35._4_4_ = iVar22;
        auVar35._0_4_ = iVar11;
        auVar35._8_4_ = iVar22;
        auVar35._12_4_ = iVar22;
        auVar34._8_8_ = auVar35._8_8_;
        auVar34._4_4_ = iVar11;
        auVar34._0_4_ = iVar11;
        uVar8 = movmskpd((int)CONCAT71(extraout_var,bVar7),auVar34);
        auVar42 = ZEXT816(0x3f800000);
        if ((uVar8 & 1) == 0) {
          auVar42 = auVar27;
        }
        local_268 = (float)(~-(uint)(auVar27._0_4_ < 0.0) & auVar42._0_4_);
        fVar26 = 0.0;
        if ((uVar8 & 2) == 0) {
          fVar26 = 1.0 - fVar10;
        }
        V = (float)(-(uint)(fVar10 < 0.0) & 0x3f800000 | ~-(uint)(fVar10 < 0.0) & (uint)fVar26);
        uVar16 = 1;
      }
      else {
        uVar16 = 0;
      }
      if ((uVar17 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      picker_size.y = local_c8;
      picker_size.x = (float)local_248._0_4_;
      SetCursorScreenPos(&picker_size);
      picker_size.y = local_1f8;
      picker_size.x = (float)local_1b8._0_4_;
      InvisibleButton("hue",&picker_size);
      bVar7 = IsItemActive();
      if (bVar7) {
        fVar10 = ((((ImGuiContext *)auVar21)->IO).MousePos.y - local_128) / (local_1f8 + -1.0);
        local_25c = 1.0;
        if (fVar10 <= 1.0) {
          local_25c = fVar10;
        }
        local_25c = (float)(~-(uint)(fVar10 < 0.0) & (uint)local_25c);
        local_26c._0_1_ = '\x01';
        uVar9 = (int)CONCAT71(extraout_var_00,1);
      }
      else {
        local_26c._0_1_ = '\0';
        uVar9 = uVar16;
      }
      local_258 = (undefined1  [4])uVar9;
    }
  }
  else {
    picker_size.y = local_1f8;
    picker_size.x =
         (((ImGuiContext *)auVar21)->Style).ItemInnerSpacing.x + local_1f8 + (float)local_1b8._0_4_;
    InvisibleButton("hsv",&picker_size);
    bVar7 = IsItemActive();
    if (bVar7) {
      fVar44 = (((ImGuiContext *)auVar21)->IO).MouseClickedPos[0].x - (float)local_258;
      fVar41 = (((ImGuiContext *)auVar21)->IO).MouseClickedPos[0].y - (float)auStack_254._0_4_;
      local_148 = ZEXT416((uint)fVar41);
      fVar26 = (((ImGuiContext *)auVar21)->IO).MousePos.x - (float)local_258;
      fVar10 = (((ImGuiContext *)auVar21)->IO).MousePos.y - (float)auStack_254._0_4_;
      local_138 = ZEXT416((uint)fVar10);
      _local_258 = ZEXT416((uint)fVar44);
      fVar41 = fVar44 * fVar44 + fVar41 * fVar41;
      if ((fVar41 < ((float)local_108._0_4_ + -1.0) * ((float)local_108._0_4_ + -1.0)) ||
         (((float)local_d8._0_4_ + 1.0) * ((float)local_d8._0_4_ + 1.0) < fVar41)) {
        local_26c = 0;
      }
      else {
        fVar10 = atan2f(fVar10,fVar26);
        fVar10 = (fVar10 / 3.1415927) * 0.5;
        local_25c = (float)(~-(uint)(fVar10 < 0.0) & (uint)fVar10 |
                           (uint)(fVar10 + 1.0) & -(uint)(fVar10 < 0.0));
        local_26c = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      local_e8 = local_25c * -2.0 * 3.1415927;
      local_1c8.x = cosf(local_e8);
      local_1c8.y = extraout_XMM0_Db;
      uStack_1c0 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
      fVar10 = sinf(local_e8);
      auVar3 = local_258;
      auStack_254._0_4_ = extraout_XMM0_Db_00;
      local_258 = (undefined1  [4])fVar10;
      auStack_254._4_4_ = extraout_XMM0_Dc_00;
      fStack_24c = (float)extraout_XMM0_Dd_00;
      picker_size.y = fVar10 * (float)auVar3 + local_1c8.x * (float)local_148._0_4_;
      picker_size.x = local_1c8.x * (float)auVar3 + -(float)local_148._0_4_ * fVar10;
      bVar7 = ImTriangleContainsPoint(&triangle_pa,&local_150,&triangle_pc,&picker_size);
      if (bVar7) {
        picker_size.x = local_1c8.x * fVar26 + -(float)local_138._0_4_ * (float)local_258;
        picker_size.y = (float)local_258 * fVar26 + local_1c8.x * (float)local_138._0_4_;
        bVar7 = ImTriangleContainsPoint(&triangle_pa,&local_150,&triangle_pc,&picker_size);
        if (!bVar7) {
          picker_size = ImTriangleClosestPoint(&triangle_pa,&local_150,&triangle_pc,&picker_size);
        }
        ImTriangleBarycentricCoords
                  (&triangle_pa,&local_150,&triangle_pc,&picker_size,&backup_pos.x,&vv,&ww);
        fVar26 = 1.0 - vv;
        fVar10 = 1.0;
        if (fVar26 <= 1.0) {
          fVar10 = fVar26;
        }
        V = (float)(-(uint)(fVar26 < 0.0001) & 0x38d1b717 | ~-(uint)(fVar26 < 0.0001) & (uint)fVar10
                   );
        fVar26 = backup_pos.x / V;
        fVar10 = 1.0;
        if (fVar26 <= 1.0) {
          fVar10 = fVar26;
        }
        local_268 = (float)(-(uint)(fVar26 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar26 < 0.0001) & (uint)fVar10);
        uVar16 = 1;
        local_258 = (undefined1  [4])(int)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
        auVar21 = local_238;
      }
      else {
        uVar16 = 0;
        local_258 = (undefined1  [4])local_26c;
      }
    }
    else {
      uVar16 = 0;
      local_26c = 0;
      auVar42._12_4_ = 0;
      auVar42._0_12_ = _auStack_254;
      _local_258 = auVar42 << 0x20;
    }
    if ((uVar17 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  fVar25 = fVar25 + (float)local_228._0_4_;
  if (uVar19 == 0x10000) {
    picker_size.y = local_c8;
    picker_size.x = fVar25;
    SetCursorScreenPos(&picker_size);
    picker_size.y = local_1f8;
    picker_size.x = (float)local_1b8._0_4_;
    InvisibleButton("alpha",&picker_size);
    bVar7 = IsItemActive();
    if (bVar7) {
      fVar26 = ((((ImGuiContext *)auVar21)->IO).MousePos.y - local_128) / (local_1f8 + -1.0);
      fVar10 = 1.0;
      if (fVar26 <= 1.0) {
        fVar10 = fVar26;
      }
      pIVar4[1].y = (float)(-(uint)(fVar26 < 0.0) & 0x3f800000 |
                           ~-(uint)(fVar26 < 0.0) & (uint)(1.0 - fVar10));
      local_258 = (undefined1  [4])(int)CONCAT71(extraout_var_01,1);
    }
  }
  PopItemFlag();
  if ((uVar17 >> 8 & 1) == 0) {
    SameLine(0.0,(((ImGuiContext *)auVar21)->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  pcVar6 = local_b8;
  if (-1 < (char)uVar17) {
    text_end = FindRenderedTextEnd(local_b8,(char *)0x0);
    if (text_end != pcVar6) {
      if ((uVar17 >> 8 & 1) != 0) {
        SameLine(0.0,*(float *)((long)local_238 + 0x156c));
      }
      TextUnformatted(local_b8,text_end);
    }
  }
  if ((uVar17 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    picker_size = *pIVar4;
    if ((uVar17 & 2) == 0) {
      afStack_210[1] = pIVar4[1].y;
    }
    else {
      afStack_210[1] = 1.0;
    }
    afStack_210[0] = pIVar4[1].x;
    if ((char)uVar17 < '\0') {
      Text("Current");
    }
    IVar20.x = (float)local_1b8._0_4_ * 3.0;
    IVar20.y = (float)local_1b8._0_4_ * 2.0;
    uStack_230._0_4_ = (float)local_1b8._0_4_ * 0.0;
    local_238._0_4_ = IVar20.x;
    local_238._4_4_ = IVar20.y;
    uStack_230._4_4_ = (float)local_1b8._0_4_ * 0.0;
    ColorButton("##current",(ImVec4 *)&picker_size,uVar17 & 0xe0040,IVar20);
    if (local_118._0_8_ != 0) {
      Text("Original");
      backup_pos = *(ImVec2 *)local_118._0_8_;
      if ((uVar17 & 2) == 0) {
        local_1d8.y = ((ImVec2 *)(local_118._0_8_ + 8))->y;
      }
      else {
        local_1d8.y = 1.0;
      }
      local_1d8.x = ((ImVec2 *)(local_118._0_8_ + 8))->x;
      bVar7 = ColorButton("##original",(ImVec4 *)&backup_pos,uVar17 & 0xe0040,(ImVec2)local_238);
      if (bVar7) {
        pvVar13 = memcpy(pIVar4,(void *)local_118._0_8_,local_f0);
        local_258 = (undefined1  [4])(int)CONCAT71((int7)((ulong)pvVar13 >> 8),1);
      }
    }
    PopItemFlag();
    EndGroup();
  }
  if (((char)local_26c != '\0') ||
     (fVar10 = (float)local_1b8._0_4_ * 0.2, fVar26 = 0.0, fVar41 = 0.0, fVar44 = 0.0,
     (char)uVar16 != '\0')) {
    _local_238 = ZEXT416((uint)((float)local_1b8._0_4_ * 0.2));
    ColorConvertHSVtoRGB
              ((float)(~-(uint)(1.0 <= local_25c) & (uint)local_25c |
                      (uint)(local_25c + -1e-05) & -(uint)(1.0 <= local_25c)),
               (float)(~-(uint)(0.0 < local_268) & 0x3727c5ac |
                      (uint)local_268 & -(uint)(0.0 < local_268)),
               (float)(~-(uint)(0.0 < V) & 0x358637bd | (uint)V & -(uint)(0.0 < V)),&pIVar4->x,
               &pIVar4->y,&pIVar4[1].x);
    fVar10 = (float)local_238._0_4_;
    fVar26 = (float)local_238._4_4_;
    fVar41 = (float)uStack_230;
    fVar44 = uStack_230._4_4_;
  }
  local_148._0_4_ = uVar16;
  out_r = pIVar4;
  iVar11 = (int)fVar10;
  iVar22 = (int)fVar26;
  iVar29 = (int)fVar41;
  iVar30 = (int)fVar44;
  if ((uVar17 & 0x20) == 0) {
    local_238._4_4_ = (int)fVar26;
    local_238._0_4_ = (int)fVar10;
    uStack_230._0_4_ = (float)(int)fVar41;
    uStack_230._4_4_ = (float)(int)fVar44;
    fVar10 = fVar25;
    if (uVar19 != 0x10000) {
      fVar10 = (float)local_248._0_4_;
    }
    PushItemWidth((fVar10 + (float)local_1b8._0_4_) - fVar23);
    uVar8 = uVar17 & 0x18e001a;
    if ((uVar17 >> 0x14 & 1) != 0 || (uVar17 & 0x600000) == 0) {
      bVar7 = ColorEdit4("##rgb",&local_208->x,uVar8 | 0x100004);
      auVar42 = _local_258;
      local_258._1_3_ = local_258._1_3_;
      local_258[0] = local_258[0] | bVar7;
      _auStack_254 = auVar42._4_12_;
    }
    if ((uVar17 >> 0x15 & 1) != 0 || (uVar17 & 0x500000) == 0) {
      bVar7 = ColorEdit4("##hsv",&local_208->x,uVar8 | 0x200004);
      auVar42 = _local_258;
      local_258._1_3_ = local_258._1_3_;
      local_258[0] = local_258[0] | bVar7;
      _auStack_254 = auVar42._4_12_;
    }
    if ((uVar17 >> 0x16 & 1) != 0 || (uVar17 & 0x300000) == 0) {
      bVar7 = ColorEdit4("##hex",&local_208->x,uVar8 | 0x400004);
      auVar42 = _local_258;
      local_258._1_3_ = local_258._1_3_;
      local_258[0] = local_258[0] | bVar7;
      _auStack_254 = auVar42._4_12_;
    }
    uVar16 = local_148._0_4_;
    PopItemWidth();
    out_r = local_208;
    iVar11 = local_238._0_4_;
    iVar22 = local_238._4_4_;
    iVar29 = (int)(float)uStack_230;
    iVar30 = (int)uStack_230._4_4_;
  }
  fVar23 = local_25c;
  cVar15 = (char)uVar16;
  local_e8 = (float)iVar11;
  fStack_e4 = (float)iVar22;
  fStack_e0 = (float)iVar29;
  fStack_dc = (float)iVar30;
  if (local_258[0] != '\0') {
    ColorConvertRGBtoHSV(out_r->x,out_r->y,out_r[1].x,&picker_size.x,&backup_pos.x,&vv);
    if ((picker_size.x <= 0.0) && (0.0 < fVar23)) {
      if (0.0 < vv) {
LAB_0017707a:
        if (0.0 < backup_pos.x) goto LAB_001770a8;
        fVar10 = local_268 * 0.5;
      }
      else {
        if ((V == vv) && (!NAN(V) && !NAN(vv))) goto LAB_0017707a;
        vv = V * 0.5;
        fVar10 = local_268;
      }
      ColorConvertHSVtoRGB(fVar23,fVar10,vv,&out_r->x,&pIVar4->y,&pIVar4[1].x);
    }
  }
LAB_001770a8:
  picker_size.x = 1.0;
  picker_size.y = 1.0;
  afStack_210[0] = 1.0;
  afStack_210[1] = 1.0;
  ColorConvertHSVtoRGB(fVar23,1.0,1.0,(float *)&picker_size,&picker_size.y,afStack_210);
  fVar10 = (float)ColorConvertFloat4ToU32((ImVec4 *)&picker_size);
  backup_pos = *out_r;
  local_1d8.y = 1.0;
  local_1d8.x = out_r[1].x;
  col_00 = ColorConvertFloat4ToU32((ImVec4 *)&backup_pos);
  pIVar5 = local_1a0;
  vv = 0.0;
  fStack_1cc = 0.0;
  if ((uVar17 >> 0x1a & 1) == 0) {
    if ((uVar17 >> 0x19 & 1) == 0) goto LAB_001778a0;
    local_138._0_4_ = col_00;
    backup_pos.y = local_128 + local_1f8;
    backup_pos.x = fVar31;
    ImDrawList::AddRectFilledMultiColor
              (local_1a0,&picker_pos,&backup_pos,0xffffffff,(ImU32)fVar10,(ImU32)fVar10,0xffffffff);
    local_238._4_4_ = local_1f8;
    local_238._0_4_ = local_1f8;
    uStack_230._0_4_ = local_1f8;
    uStack_230._4_4_ = local_1f8;
    backup_pos.x = picker_pos.x + local_1f8;
    backup_pos.y = picker_pos.y + local_1f8;
    ImDrawList::AddRectFilledMultiColor(pIVar5,&picker_pos,&backup_pos,0,0,0xff000000,0xff000000);
    p_max.x = (float)local_238._0_4_ + picker_pos.x;
    p_max.y = (float)local_238._4_4_ + picker_pos.y;
    RenderFrameBorder(picker_pos,p_max,0.0);
    auVar40._4_4_ = 1.0 - V;
    auVar40._0_4_ = local_268;
    auVar40._8_8_ = 0;
    auVar42 = minps(_DAT_0018a110,auVar40);
    fVar24 = picker_pos.x;
    fVar28 = picker_pos.y;
    auVar43._0_4_ = (float)local_238._0_4_ + fVar24 + -2.0;
    auVar43._4_4_ = (float)local_238._4_4_ + fVar28 + -2.0;
    auVar43._8_4_ = (float)uStack_230 + 0.0 + 0.0;
    auVar43._12_4_ = uStack_230._4_4_ + 0.0 + 0.0;
    auVar36._0_4_ =
         (float)(int)((float)(-(uint)(0.0 <= local_268) & auVar42._0_4_) * (float)local_238._0_4_ +
                      fVar24 + 0.5);
    auVar36._4_4_ =
         (float)(int)((float)(-(uint)(0.0 <= 1.0 - V) & auVar42._4_4_) * (float)local_238._4_4_ +
                      fVar28 + 0.5);
    auVar36._8_4_ = (float)(int)(auVar42._8_4_ * (float)uStack_230 + 0.0 + 0.0);
    auVar36._12_4_ = (float)(int)(auVar42._12_4_ * uStack_230._4_4_ + 0.0 + 0.0);
    auVar42 = minps(auVar43,auVar36);
    uVar17 = -(uint)(auVar36._0_4_ < fVar24 + 2.0);
    uVar8 = -(uint)(auVar36._4_4_ < fVar28 + 2.0);
    _vv = (ImVec2)(CONCAT44(~uVar8 & auVar42._4_4_,~uVar17 & auVar42._0_4_) |
                  CONCAT44((uint)(fVar28 + 2.0) & uVar8,(uint)(fVar24 + 2.0) & uVar17));
    local_238._4_4_ = fStack_1f4;
    local_238._0_4_ = local_1f8 / 6.0;
    uStack_230._0_4_ = (float)uStack_1f0;
    uStack_230._4_4_ = (float)uStack_1ec;
    lVar18 = 0;
    while( true ) {
      if (lVar18 == 6) break;
      backup_pos.y = (float)(int)lVar18 * (float)local_238._0_4_ + picker_pos.y;
      backup_pos.x = (float)local_248._0_4_;
      fStack_154 = (float)(int)(lVar18 + 1) * (float)local_238._0_4_ + picker_pos.y;
      ww = (float)local_228._0_4_;
      ImDrawList::AddRectFilledMultiColor
                (pIVar5,&backup_pos,(ImVec2 *)&ww,(&DAT_001b44b0)[lVar18],(&DAT_001b44b0)[lVar18],
                 (&DAT_001b44b4)[lVar18],(&DAT_001b44b4)[lVar18]);
      lVar18 = lVar18 + 1;
    }
    _local_238 = ZEXT416((uint)(float)(int)(fVar23 * local_1f8 + picker_pos.y + 0.5));
    p_min.y = picker_pos.y;
    p_min.x = (float)local_248._0_4_;
    p_max_00.y = local_1f8 + picker_pos.y;
    p_max_00.x = (float)local_228._0_4_;
    RenderFrameBorder(p_min,p_max_00,0.0);
    pos.x = (float)local_248._0_4_ + -1.0;
    pos.y = (float)local_238._0_4_;
    half_sz.x = local_e8 + 1.0;
    half_sz.y = local_e8;
    RenderArrowsForVerticalBar(pIVar5,pos,half_sz,(float)local_1b8._0_4_ + 2.0);
  }
  else {
    local_138._0_4_ = col_00;
    local_118 = ZEXT416((uint)(1.5 / (float)local_d8._0_4_));
    iVar11 = 4;
    if (4 < (int)(float)local_d8._0_4_ / 0xc) {
      iVar11 = (int)(float)local_d8._0_4_ / 0xc;
    }
    local_b8 = (char *)CONCAT44(0x80000000,-(1.5 / (float)local_d8._0_4_));
    uStack_b0 = 0x80000000;
    uStack_ac = 0x80000000;
    local_d8._0_4_ = (float)local_d8._0_4_ + (float)local_108._0_4_;
    local_c8 = (float)local_d8._0_4_ * 0.5;
    local_108._4_4_ = local_108._0_4_;
    fStack_100 = (float)local_108._0_4_;
    fStack_fc = (float)local_108._0_4_;
    local_128 = fVar10;
    for (lVar18 = 0; lVar18 != 6; lVar18 = lVar18 + 1) {
      fVar31 = (float)(int)lVar18 / 6.0;
      fVar10 = (fVar31 + fVar31) * 3.1415927 + (float)local_b8;
      local_1c8.x = fVar10;
      fVar31 = ((float)(int)lVar18 + 1.0) / 6.0;
      fVar31 = (fVar31 + fVar31) * 3.1415927 + (float)local_118._0_4_;
      local_238._0_4_ = fVar31;
      iVar22 = (pIVar5->VtxBuffer).Size;
      ImDrawList::PathArcTo(pIVar5,&local_200,local_c8,fVar10,fVar31,iVar11);
      ImDrawList::PathStroke(pIVar5,0xffffffff,false,local_260);
      iVar29 = (pIVar5->VtxBuffer).Size;
      _local_248 = ZEXT416((uint)local_200.x);
      local_228._0_4_ = cosf(local_1c8.x);
      local_228._4_4_ = extraout_XMM0_Db_01;
      fStack_220 = (float)extraout_XMM0_Dc_01;
      fStack_21c = (float)extraout_XMM0_Dd_01;
      auVar37._4_4_ = local_200.y;
      auVar37._0_4_ = local_248._0_4_;
      auVar37._8_4_ = local_248._4_4_;
      auVar37._12_4_ = 0;
      _local_248 = auVar37;
      fVar31 = sinf(local_1c8.x);
      fVar10 = (float)local_228._4_4_ * fStack_100;
      local_228._4_4_ = fVar31 * (float)local_108._4_4_ + (float)local_248._4_4_;
      local_228._0_4_ = (float)local_228._0_4_ * (float)local_108._0_4_ + (float)local_248._0_4_;
      fStack_220 = fVar10 + fStack_240;
      fStack_21c = extraout_XMM0_Db_02 * fStack_fc + fStack_23c;
      _local_248 = ZEXT416((uint)local_200.x);
      local_1c8.x = cosf((float)local_238._0_4_);
      local_1c8.y = extraout_XMM0_Db_03;
      uStack_1c0 = CONCAT44(extraout_XMM0_Dd_02,extraout_XMM0_Dc_02);
      auVar38._4_4_ = local_200.y;
      auVar38._0_4_ = local_248._0_4_;
      auVar38._8_4_ = local_248._4_4_;
      auVar38._12_4_ = 0;
      _local_248 = auVar38;
      fVar31 = sinf((float)local_238._0_4_);
      gradient_p1.x = local_1c8.x * (float)local_108._0_4_ + (float)local_248._0_4_;
      gradient_p1.y = fVar31 * (float)local_108._4_4_ + (float)local_248._4_4_;
      pIVar1 = (pIVar5->VtxBuffer).Data;
      ShadeVertsLinearColorGradientKeepAlpha
                (pIVar1 + iVar22,pIVar1 + iVar29,(ImVec2)local_228,gradient_p1,
                 (&DAT_001b44b0)[lVar18],(&DAT_001b44b4)[lVar18]);
    }
    fVar23 = (fVar23 + fVar23) * 3.1415927;
    local_228._0_4_ = cosf(fVar23);
    local_228._4_4_ = extraout_XMM0_Db_04;
    fStack_220 = (float)extraout_XMM0_Dc_03;
    fStack_21c = (float)extraout_XMM0_Dd_03;
    local_248._0_4_ = sinf(fVar23);
    fVar23 = local_128;
    pIVar5 = local_1a0;
    local_248._4_4_ = extraout_XMM0_Db_05;
    fStack_240 = (float)extraout_XMM0_Dc_04;
    fStack_23c = (float)extraout_XMM0_Dd_04;
    backup_pos.x = (float)local_228._0_4_ * (float)local_d8._0_4_ * 0.5 + local_200.x;
    backup_pos.y = (float)local_248._0_4_ * (float)local_d8._0_4_ * 0.5 + local_200.y;
    if ((char)local_26c == '\0') {
      fVar31 = 0.55;
    }
    else {
      fVar31 = 0.65;
    }
    local_260 = local_260 * fVar31;
    iVar11 = 0x20;
    if ((int)(local_260 / 1.4) < 0x20) {
      iVar11 = (int)(local_260 / 1.4);
    }
    iVar22 = 9;
    if (9 < iVar11) {
      iVar22 = iVar11;
    }
    ImDrawList::AddCircleFilled(local_1a0,&backup_pos,local_260,(ImU32)local_128,iVar22);
    ImDrawList::AddCircle(pIVar5,&backup_pos,local_260 + 1.0,0xff808080,iVar22,1.0);
    ImDrawList::AddCircle(pIVar5,&backup_pos,local_260,0xffffffff,iVar22,1.0);
    ww = fVar39 * (float)local_228._0_4_ + (float)local_248._0_4_ * -0.0 + local_200.x;
    fStack_154 = fVar39 * (float)local_248._0_4_ + (float)local_228._0_4_ * 0.0 + local_200.y;
    trb.y = fVar28 * (float)local_228._0_4_ + fVar24 * (float)local_248._0_4_ + local_200.y;
    trb.x = -fVar28 * (float)local_248._0_4_ + fVar24 * (float)local_228._0_4_ + local_200.x;
    trc.x = -fVar32 * (float)local_248._0_4_ + fVar24 * (float)local_228._0_4_ + local_200.x;
    trc.y = fVar32 * (float)local_228._0_4_ + fVar24 * (float)local_248._0_4_ + local_200.y;
    uv_white = (GImGui->DrawListSharedData).TexUvWhitePixel;
    ImDrawList::PrimReserve(pIVar5,6,6);
    ImDrawList::PrimVtx(pIVar5,(ImVec2 *)&ww,&uv_white,(ImU32)fVar23);
    ImDrawList::PrimVtx(pIVar5,&trb,&uv_white,(ImU32)fVar23);
    ImDrawList::PrimVtx(pIVar5,&trc,&uv_white,0xffffffff);
    ImDrawList::PrimVtx(pIVar5,(ImVec2 *)&ww,&uv_white,0);
    ImDrawList::PrimVtx(pIVar5,&trb,&uv_white,0xff000000);
    ImDrawList::PrimVtx(pIVar5,&trc,&uv_white,0);
    ImDrawList::AddTriangle(pIVar5,(ImVec2 *)&ww,&trb,&trc,0xff808080,1.5);
    fVar23 = 1.0;
    if (local_268 <= 1.0) {
      fVar23 = local_268;
    }
    fVar23 = (float)(~-(uint)(local_268 < 0.0) & (uint)fVar23);
    fVar28 = 1.0 - V;
    fVar24 = 1.0;
    if (fVar28 <= 1.0) {
      fVar24 = fVar28;
    }
    fVar24 = (float)(~-(uint)(fVar28 < 0.0) & (uint)fVar24);
    fVar28 = fVar23 * (ww - trc.x) + trc.x;
    fVar23 = fVar23 * (ww._4_4_ - trc.y) + trc.y;
    vv = fVar24 * (trb.x - fVar28) + fVar28;
    fStack_1cc = fVar24 * (trb.y - fVar23) + fVar23;
  }
  cVar15 = local_148[0];
  col_00 = local_138._0_4_;
LAB_001778a0:
  pIVar5 = local_1a0;
  if (cVar15 == '\0') {
    fVar23 = 6.0;
  }
  else {
    fVar23 = 10.0;
  }
  local_228._0_4_ = fVar23;
  ImDrawList::AddCircleFilled(local_1a0,(ImVec2 *)&vv,fVar23,col_00,0xc);
  ImDrawList::AddCircle(pIVar5,(ImVec2 *)&vv,(float)local_228._0_4_ + 1.0,0xff808080,0xc,1.0);
  ImDrawList::AddCircle(pIVar5,(ImVec2 *)&vv,(float)local_228._0_4_,0xffffffff,0xc,1.0);
  pIVar4 = local_208;
  if (uVar19 == 0x10000) {
    fVar23 = local_208[1].y;
    _local_248 = ZEXT416((uint)fVar23);
    fVar24 = 1.0;
    if (fVar23 <= 1.0) {
      fVar24 = fVar23;
    }
    _local_228 = ZEXT416((uint)(1.0 - fVar24));
    backup_pos.y = picker_pos.y;
    backup_pos.x = fVar25;
    local_1d8.x = fVar25 + (float)local_1b8._0_4_;
    local_1d8.y = picker_pos.y + local_1f8;
    RenderColorRectWithAlphaCheckerboard
              (backup_pos,local_1d8,0,(local_1d8.x - fVar25) * 0.5,(ImVec2)0x0,0.0,-1);
    ImDrawList::AddRectFilledMultiColor
              (pIVar5,&backup_pos,&local_1d8,col_00,col_00,col_00 & 0xffffff,col_00 & 0xffffff);
    local_228._4_4_ = (float)(int)(float)(~local_248._4_4_ & local_228._4_4_);
    local_228._0_4_ =
         (float)(int)((float)(-(uint)((float)local_248._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_248._0_4_ < 0.0) & local_228._0_4_) * local_1f8 +
                      picker_pos.y + 0.5);
    fStack_220 = (float)(int)(float)(~(uint)fStack_240 & (uint)fStack_220);
    fStack_21c = (float)(int)(float)(~(uint)fStack_23c & (uint)fStack_21c);
    RenderFrameBorder(backup_pos,local_1d8,0.0);
    pos_00.x = fVar25 + -1.0;
    pos_00.y = (float)local_228._0_4_;
    half_sz_00.x = local_e8 + 1.0;
    half_sz_00.y = local_e8;
    RenderArrowsForVerticalBar(pIVar5,pos_00,half_sz_00,(float)local_1b8._0_4_ + 2.0);
  }
  EndGroup();
  PopID();
  if (local_258[0] == '\0') {
    bVar7 = false;
  }
  else {
    iVar11 = bcmp(backup_initial_col,pIVar4,local_f0);
    bVar7 = iVar11 != 0;
  }
  return bVar7;
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImDrawList* draw_list = window->DrawList;

    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(flags, col);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    IM_ASSERT(ImIsPowerOfTwo((int)(flags & ImGuiColorEditFlags__PickerMask))); // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, CalcItemWidth() - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = (float)(int)(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size*0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H,S,V;
    ColorConvertRGBtoHSV(col[0], col[1], col[2], H, S, V);

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner-1)*(wheel_r_inner-1) && initial_dist2 <= (wheel_r_outer+1)*(wheel_r_outer+1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI*0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size-1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextUnformatted(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");
        ColorButton("##current", col_v4, (flags & (ImGuiColorEditFlags_HDR|ImGuiColorEditFlags_AlphaPreview|ImGuiColorEditFlags_AlphaPreviewHalf|ImGuiColorEditFlags_NoTooltip)), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & (ImGuiColorEditFlags_HDR|ImGuiColorEditFlags_AlphaPreview|ImGuiColorEditFlags_AlphaPreviewHalf|ImGuiColorEditFlags_NoTooltip)), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
        ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10*1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);

    // R,G,B and H,S,V slider color editor
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_RGB || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            value_changed |= ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_RGB);
        if (flags & ImGuiColorEditFlags_HSV || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_HSV);
        if (flags & ImGuiColorEditFlags_HEX || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_HEX);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit), if any
    if (value_changed)
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    ImVec4 hue_color_f(1, 1, 1, 1); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 col32_no_alpha = ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 1.0f));

    const ImU32 hue_colors[6+1] = { IM_COL32(255,0,0,255), IM_COL32(255,255,0,255), IM_COL32(0,255,0,255), IM_COL32(0,255,255,255), IM_COL32(0,0,255,255), IM_COL32(255,0,255,255), IM_COL32(255,0,0,255) };
    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 1.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(IM_COL32_WHITE, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list->VtxBuffer.Data + vert_start_idx, draw_list->VtxBuffer.Data + vert_end_idx, gradient_p0, gradient_p1, hue_colors[n], hue_colors[n+1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad+1, IM_COL32(128,128,128,255), hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, IM_COL32_WHITE, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_WHITE);
        draw_list->PrimVtx(tra, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->PrimVtx(trb, uv_white, IM_COL32_BLACK);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->AddTriangle(tra, trb, trc, IM_COL32(128,128,128,255), 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_WHITE, hue_color32, hue_color32, IM_COL32_WHITE);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_BLACK_TRANS, IM_COL32_BLACK_TRANS, IM_COL32_BLACK, IM_COL32_BLACK);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp((float)(int)(picker_pos.x + ImSaturate(S)     * sv_picker_size + 0.5f), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp((float)(int)(picker_pos.y + ImSaturate(1 - V) * sv_picker_size + 0.5f), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), hue_colors[i], hue_colors[i], hue_colors[i + 1], hue_colors[i + 1]);
        float bar0_line_y = (float)(int)(picker_pos.y + H * sv_picker_size + 0.5f);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, col32_no_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad+1, IM_COL32(128,128,128,255), 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, IM_COL32_WHITE, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(bar1_bb.Min, bar1_bb.Max, IM_COL32(0,0,0,0), bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, col32_no_alpha, col32_no_alpha, col32_no_alpha & ~IM_COL32_A_MASK, col32_no_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = (float)(int)(picker_pos.y + (1.0f - alpha) * sv_picker_size + 0.5f);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    EndGroup();
    PopID();

    return value_changed && memcmp(backup_initial_col, col, components * sizeof(float));
}